

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack1to4.h
# Opt level: O3

void ncnn::im2col_sgemm_pack1to4_sse
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int *piVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  int iVar17;
  _func_int ***ppp_Var18;
  undefined4 *puVar19;
  ulong uVar20;
  uint uVar21;
  int nn;
  int iVar22;
  ulong uVar23;
  long lVar24;
  undefined4 *puVar25;
  void **ppvVar26;
  uint uVar27;
  ulong uVar28;
  float *pfVar29;
  char cVar30;
  uint uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  undefined4 *puVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float zeros [4];
  undefined1 local_a8 [64];
  size_t local_68;
  ulong local_58;
  Mat *local_50;
  void *local_48;
  undefined8 uStack_40;
  
  uVar5 = bottom_im2col->w;
  uVar23 = (ulong)(int)uVar5;
  iVar22 = bottom_im2col->h;
  uVar27 = bottom_im2col->c;
  uVar20 = (ulong)uVar27;
  local_58 = (ulong)(uint)top_blob->c;
  local_68 = 0;
  local_a8._0_8_ = (Allocator *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_a8._24_4_ = 0;
  local_a8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if ((long)uVar23 < 8) {
    uVar16 = uVar5;
    iVar17 = iVar22;
    if (3 < (int)uVar5) {
      iVar17 = iVar22 * 4;
      uVar16 = (uVar5 & 3) + 1;
    }
  }
  else {
    uVar16 = (uVar5 & 3) + (uVar5 >> 3) + (uint)((uVar5 >> 2 & 1) != 0);
    iVar17 = iVar22 * 8;
  }
  local_a8._32_8_ = local_a8._0_8_;
  local_a8._40_4_ = local_a8._8_4_;
  local_a8._44_4_ = local_a8._12_4_;
  local_50 = _bias;
  Mat::create((Mat *)local_a8,iVar17,uVar27,uVar16,4,1,(Allocator *)opt);
  uVar16 = (int)uVar5 >> 3;
  if (0 < (int)uVar16) {
    lVar24 = 0x10;
    uVar28 = 0;
    do {
      if (0 < (int)uVar27) {
        ppp_Var18 = (_func_int ***)
                    ((long)(_func_int ***)local_a8._0_8_ + local_68 * uVar28 * local_a8._16_8_);
        uVar32 = 0;
        do {
          if (0 < iVar22) {
            sVar6 = bottom_im2col->cstep;
            sVar7 = bottom_im2col->elemsize;
            lVar35 = (long)bottom_im2col->data + lVar24;
            iVar17 = iVar22;
            do {
              *(undefined1 (*) [32])ppp_Var18 =
                   *(undefined1 (*) [32])(lVar35 + -0x10 + sVar6 * sVar7 * uVar32);
              ppp_Var18 = ppp_Var18 + 4;
              lVar35 = lVar35 + (ulong)uVar5 * 4;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar20);
      }
      uVar28 = uVar28 + 1;
      lVar24 = lVar24 + 0x20;
    } while (uVar28 != uVar16);
  }
  uVar21 = uVar5 >> 2 & 1;
  if ((uVar21 != 0) && (0 < (int)uVar27)) {
    ppp_Var18 = (_func_int ***)
                ((long)(_func_int ***)local_a8._0_8_ +
                (long)(int)uVar16 * local_68 * local_a8._16_8_);
    uVar28 = 0;
    do {
      if (0 < iVar22) {
        pauVar33 = (undefined1 (*) [16])
                   ((long)bottom_im2col->data +
                   bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 +
                   (uVar23 & 0xfffffffffffffff8) * 4);
        iVar17 = iVar22;
        do {
          *(undefined1 (*) [16])ppp_Var18 = *pauVar33;
          ppp_Var18 = ppp_Var18 + 2;
          pauVar33 = (undefined1 (*) [16])(*pauVar33 + uVar23 * 4);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar20);
  }
  iVar17 = (int)(uVar23 & 0xfffffffffffffff8) + uVar21 * 4;
  if (iVar17 < (int)uVar5) {
    lVar24 = (long)iVar17;
    puVar19 = (undefined4 *)(lVar24 * 4 + (long)bottom_im2col->data);
    sVar6 = bottom_im2col->cstep;
    sVar7 = bottom_im2col->elemsize;
    do {
      if (0 < (int)uVar27) {
        uVar16 = (uint)lVar24;
        uVar21 = uVar16 + 3;
        if (-1 < (int)uVar16) {
          uVar21 = uVar16;
        }
        uVar31 = uVar16 + 7;
        if (-1 < (int)uVar16) {
          uVar31 = uVar16;
        }
        cVar30 = (char)lVar24 - ((byte)uVar31 & 0xf8);
        ppp_Var18 = (_func_int ***)
                    ((long)(_func_int ***)local_a8._0_8_ +
                    (long)(int)((int)((char)(((byte)(cVar30 >> 7) >> 6) + cVar30) >> 2) +
                               ((int)uVar31 >> 3) + (uVar16 - (uVar21 & 0xfffffffc))) *
                    local_68 * local_a8._16_8_);
        uVar28 = 0;
        puVar25 = puVar19;
        do {
          puVar34 = puVar25;
          iVar17 = iVar22;
          if (0 < iVar22) {
            do {
              *(undefined4 *)ppp_Var18 = *puVar34;
              ppp_Var18 = (_func_int ***)((long)ppp_Var18 + 4);
              puVar34 = puVar34 + uVar23;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          uVar28 = uVar28 + 1;
          puVar25 = (undefined4 *)((long)puVar25 + sVar6 * sVar7);
        } while (uVar28 != uVar20);
      }
      lVar24 = lVar24 + 1;
      puVar19 = puVar19 + 1;
    } while (lVar24 < (long)uVar23);
  }
  if (0 < (int)local_58) {
    iVar22 = iVar22 * uVar27;
    uVar20 = 0;
    do {
      pauVar33 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar20 * top_blob->elemsize + (long)top_blob->data);
      ppvVar26 = &local_50->data + uVar20 * 2;
      if (local_50 == (Mat *)0x0) {
        ppvVar26 = &local_48;
      }
      local_48 = (void *)0x0;
      uStack_40 = 0;
      if ((int)uVar5 < 8) {
        uVar28 = 0;
      }
      else {
        lVar24 = 0;
        uVar32 = 0;
        do {
          auVar50 = *(undefined1 (*) [16])ppvVar26;
          auVar49 = auVar50;
          auVar48 = auVar50;
          auVar47 = auVar50;
          auVar45 = auVar50;
          auVar43 = auVar50;
          auVar41 = auVar50;
          auVar38 = auVar50;
          if (0 < iVar22) {
            lVar35 = local_68 * local_a8._16_8_ * lVar24;
            lVar36 = 0;
            iVar17 = iVar22;
            auVar46 = auVar50;
            auVar44 = auVar50;
            auVar42 = auVar50;
            auVar39 = auVar50;
            auVar40 = auVar50;
            auVar13 = auVar50;
            auVar14 = auVar50;
            auVar15 = auVar50;
            do {
              pfVar29 = (float *)((long)kernel->data +
                                 lVar36 + kernel->cstep * uVar20 * kernel->elemsize);
              fVar2 = *pfVar29;
              fVar3 = pfVar29[1];
              fVar4 = pfVar29[2];
              fVar8 = pfVar29[3];
              fVar1 = *(float *)((long)(_func_int ***)local_a8._0_8_ + lVar36 * 2 + lVar35);
              auVar50._0_4_ = fVar1 * fVar2 + auVar15._0_4_;
              auVar50._4_4_ = fVar1 * fVar3 + auVar15._4_4_;
              auVar50._8_4_ = fVar1 * fVar4 + auVar15._8_4_;
              auVar50._12_4_ = fVar1 * fVar8 + auVar15._12_4_;
              fVar1 = *(float *)((long)(_func_int ***)local_a8._0_8_ + lVar36 * 2 + lVar35 + 4);
              auVar49._0_4_ = fVar1 * fVar2 + auVar14._0_4_;
              auVar49._4_4_ = fVar1 * fVar3 + auVar14._4_4_;
              auVar49._8_4_ = fVar1 * fVar4 + auVar14._8_4_;
              auVar49._12_4_ = fVar1 * fVar8 + auVar14._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 8))->_vptr_Allocator +
                                lVar36 * 2 + lVar35);
              auVar48._0_4_ = fVar1 * fVar2 + auVar13._0_4_;
              auVar48._4_4_ = fVar1 * fVar3 + auVar13._4_4_;
              auVar48._8_4_ = fVar1 * fVar4 + auVar13._8_4_;
              auVar48._12_4_ = fVar1 * fVar8 + auVar13._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 8))->_vptr_Allocator +
                                lVar36 * 2 + lVar35 + 4);
              auVar47._0_4_ = fVar1 * fVar2 + auVar40._0_4_;
              auVar47._4_4_ = fVar1 * fVar3 + auVar40._4_4_;
              auVar47._8_4_ = fVar1 * fVar4 + auVar40._8_4_;
              auVar47._12_4_ = fVar1 * fVar8 + auVar40._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar36 * 2 + lVar35);
              auVar45._0_4_ = fVar1 * fVar2 + auVar39._0_4_;
              auVar45._4_4_ = fVar1 * fVar3 + auVar39._4_4_;
              auVar45._8_4_ = fVar1 * fVar4 + auVar39._8_4_;
              auVar45._12_4_ = fVar1 * fVar8 + auVar39._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x10))->_vptr_Allocator +
                                lVar36 * 2 + lVar35 + 4);
              auVar43._0_4_ = fVar1 * fVar2 + auVar42._0_4_;
              auVar43._4_4_ = fVar1 * fVar3 + auVar42._4_4_;
              auVar43._8_4_ = fVar1 * fVar4 + auVar42._8_4_;
              auVar43._12_4_ = fVar1 * fVar8 + auVar42._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar36 * 2 + lVar35);
              auVar41._0_4_ = fVar1 * fVar2 + auVar44._0_4_;
              auVar41._4_4_ = fVar1 * fVar3 + auVar44._4_4_;
              auVar41._8_4_ = fVar1 * fVar4 + auVar44._8_4_;
              auVar41._12_4_ = fVar1 * fVar8 + auVar44._12_4_;
              fVar1 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 0x18))->_vptr_Allocator +
                                lVar36 * 2 + lVar35 + 4);
              auVar38._0_4_ = fVar1 * fVar2 + auVar46._0_4_;
              auVar38._4_4_ = fVar1 * fVar3 + auVar46._4_4_;
              auVar38._8_4_ = fVar1 * fVar4 + auVar46._8_4_;
              auVar38._12_4_ = fVar1 * fVar8 + auVar46._12_4_;
              lVar36 = lVar36 + 0x10;
              iVar17 = iVar17 + -1;
              auVar46 = auVar38;
              auVar44 = auVar41;
              auVar42 = auVar43;
              auVar39 = auVar45;
              auVar40 = auVar47;
              auVar13 = auVar48;
              auVar14 = auVar49;
              auVar15 = auVar50;
            } while (iVar17 != 0);
          }
          *pauVar33 = auVar50;
          pauVar33[1] = auVar49;
          pauVar33[2] = auVar48;
          pauVar33[3] = auVar47;
          pauVar33[4] = auVar45;
          pauVar33[5] = auVar43;
          pauVar33[6] = auVar41;
          pauVar33[7] = auVar38;
          pauVar33 = pauVar33 + 8;
          uVar28 = uVar32 + 8;
          lVar35 = uVar32 + 0xf;
          lVar24 = lVar24 + 1;
          uVar32 = uVar28;
        } while (lVar35 < (long)uVar23);
      }
      if ((int)((uint)uVar28 | 3) < (int)uVar5) {
        uVar27 = 0;
        do {
          auVar46 = *(undefined1 (*) [16])ppvVar26;
          iVar17 = (int)uVar28;
          auVar44 = auVar46;
          auVar42 = auVar46;
          auVar39 = auVar46;
          if (0 < iVar22) {
            lVar24 = local_68 * local_a8._16_8_ *
                     (ulong)((uVar27 & 1) + ((uint)(uVar28 >> 3) & 0x1fffffff));
            lVar35 = 0;
            iVar37 = iVar22;
            auVar50 = auVar46;
            auVar49 = auVar46;
            auVar48 = auVar46;
            auVar47 = auVar46;
            do {
              pfVar29 = (float *)((long)kernel->data +
                                 lVar35 + kernel->cstep * uVar20 * kernel->elemsize);
              fVar8 = *pfVar29;
              fVar9 = pfVar29[1];
              fVar10 = pfVar29[2];
              fVar11 = pfVar29[3];
              fVar1 = *(float *)((long)(_func_int ***)local_a8._0_8_ + lVar35 + lVar24);
              fVar2 = *(float *)((long)(_func_int ***)local_a8._0_8_ + lVar35 + lVar24 + 4);
              fVar3 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 8))->_vptr_Allocator +
                                lVar35 + lVar24);
              fVar4 = *(float *)((long)&((Allocator *)(local_a8._0_8_ + 8))->_vptr_Allocator +
                                lVar35 + lVar24 + 4);
              auVar46._0_4_ = fVar1 * fVar8 + auVar47._0_4_;
              auVar46._4_4_ = fVar1 * fVar9 + auVar47._4_4_;
              auVar46._8_4_ = fVar1 * fVar10 + auVar47._8_4_;
              auVar46._12_4_ = fVar1 * fVar11 + auVar47._12_4_;
              auVar44._0_4_ = fVar2 * fVar8 + auVar48._0_4_;
              auVar44._4_4_ = fVar2 * fVar9 + auVar48._4_4_;
              auVar44._8_4_ = fVar2 * fVar10 + auVar48._8_4_;
              auVar44._12_4_ = fVar2 * fVar11 + auVar48._12_4_;
              auVar42._0_4_ = fVar3 * fVar8 + auVar49._0_4_;
              auVar42._4_4_ = fVar3 * fVar9 + auVar49._4_4_;
              auVar42._8_4_ = fVar3 * fVar10 + auVar49._8_4_;
              auVar42._12_4_ = fVar3 * fVar11 + auVar49._12_4_;
              auVar39._0_4_ = fVar4 * fVar8 + auVar50._0_4_;
              auVar39._4_4_ = fVar4 * fVar9 + auVar50._4_4_;
              auVar39._8_4_ = fVar4 * fVar10 + auVar50._8_4_;
              auVar39._12_4_ = fVar4 * fVar11 + auVar50._12_4_;
              lVar35 = lVar35 + 0x10;
              iVar37 = iVar37 + -1;
              auVar50 = auVar39;
              auVar49 = auVar42;
              auVar48 = auVar44;
              auVar47 = auVar46;
            } while (iVar37 != 0);
          }
          *pauVar33 = auVar46;
          pauVar33[1] = auVar44;
          pauVar33[2] = auVar42;
          pauVar33[3] = auVar39;
          pauVar33 = pauVar33 + 4;
          uVar16 = iVar17 + 4;
          uVar32 = (ulong)uVar16;
          uVar27 = (uint)(byte)((char)uVar27 + 1);
          uVar28 = (ulong)uVar16;
        } while (iVar17 + 7 < (int)uVar5);
      }
      else {
        uVar32 = uVar28 & 0xffffffff;
      }
      if ((int)uVar32 < (int)uVar5) {
        do {
          uVar27 = (uint)uVar32;
          auVar40 = *(undefined1 (*) [16])ppvVar26;
          if (0 < iVar22) {
            pfVar29 = (float *)(kernel->cstep * uVar20 * kernel->elemsize + (long)kernel->data);
            lVar24 = 0;
            auVar50 = auVar40;
            do {
              fVar1 = *(float *)((long)(_func_int ***)local_a8._0_8_ +
                                lVar24 * 4 +
                                local_68 * local_a8._16_8_ *
                                (ulong)((uVar27 & 3) + (int)(uVar32 >> 3) +
                                       (uint)((uVar27 >> 2 & 1) != 0)));
              auVar40._0_4_ = fVar1 * *pfVar29 + auVar50._0_4_;
              auVar40._4_4_ = fVar1 * pfVar29[1] + auVar50._4_4_;
              auVar40._8_4_ = fVar1 * pfVar29[2] + auVar50._8_4_;
              auVar40._12_4_ = fVar1 * pfVar29[3] + auVar50._12_4_;
              pfVar29 = pfVar29 + 4;
              lVar24 = lVar24 + 1;
              auVar50 = auVar40;
            } while (iVar22 != (int)lVar24);
          }
          *pauVar33 = auVar40;
          pauVar33 = pauVar33 + 1;
          uVar32 = (ulong)(uVar27 + 1);
        } while (uVar27 + 1 != uVar5);
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != local_58);
  }
  piVar12 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar12 != (int *)0x0) {
    LOCK();
    *piVar12 = *piVar12 + -1;
    UNLOCK();
    if (*piVar12 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_a8._0_8_ != (Allocator *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack1to4_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 4u, 1, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + (size % 8) / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + size % 4, 4u, 1, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 4u, 1, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    __m128 _r1 = _mm_loadu_ps(img0 + 4);
                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);

                    img0 += size;
                    tmpptr += 8;
                }
            }
        }

        remain_size_start += nn_size << 3;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _r0 = _mm_loadu_ps(img0);
                    _mm_store_ps(tmpptr, _r0);

                    img0 += size;
                    tmpptr += 4;
                }
            }
        }

        remain_size_start += nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    img0 += size;
                    tmpptr += 1;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            const float* tmpptr = tmp.channel(i / 8);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;
            __m128 _sum4 = _sum0;
            __m128 _sum5 = _sum0;
            __m128 _sum6 = _sum0;
            __m128 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);
                __m128 _val4 = _mm_load1_ps(tmpptr + 4);
                __m128 _val5 = _mm_load1_ps(tmpptr + 5);
                __m128 _val6 = _mm_load1_ps(tmpptr + 6);
                __m128 _val7 = _mm_load1_ps(tmpptr + 7);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm_comp_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm_comp_fmadd_ps(_val7, _w0, _sum7);

                tmpptr += 8;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            _mm_store_ps(outptr0 + 16, _sum4);
            _mm_store_ps(outptr0 + 20, _sum5);
            _mm_store_ps(outptr0 + 24, _sum6);
            _mm_store_ps(outptr0 + 28, _sum7);
            outptr0 += 32;
        }
        for (; i + 3 < size; i += 4)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _sum0;
            __m128 _sum2 = _sum0;
            __m128 _sum3 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);

                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_val3, _w0, _sum3);

                tmpptr += 4;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i < size; i++)
        {
            const float* tmpptr = tmp.channel(i / 8 + (i % 8) / 4 + i % 4);
            const float* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _val = _mm_load1_ps(tmpptr);
                _sum = _mm_comp_fmadd_ps(_w0, _val, _sum);

                tmpptr += 1;
                kptr0 += 4;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }
}